

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsScene::itemsBoundingRect(QGraphicsScene *this)

{
  bool bVar1;
  const_iterator o;
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items_;
  undefined8 in_stack_ffffffffffffff90;
  SortOrder order;
  QGraphicsScene *in_stack_ffffffffffffff98;
  QGraphicsItem *in_stack_ffffffffffffffa8;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  order = (SortOrder)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->xp = -NAN;
  in_RDI->yp = -NAN;
  in_RDI->w = -NAN;
  in_RDI->h = -NAN;
  QRectF::QRectF(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  items(in_stack_ffffffffffffff98,order);
  local_28.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RDI);
  o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RDI);
  while( true ) {
    bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_28,o);
    if (!bVar1) break;
    QList<QGraphicsItem_*>::const_iterator::operator*(&local_28);
    QGraphicsItem::sceneBoundingRect(in_stack_ffffffffffffffa8);
    QRectF::operator|=(in_RSI,in_RDI);
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_28);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9c0d02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsScene::itemsBoundingRect() const
{
    // Does not take untransformable items into account.
    QRectF boundingRect;
    const auto items_ = items();
    for (QGraphicsItem *item : items_)
        boundingRect |= item->sceneBoundingRect();
    return boundingRect;
}